

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef::~IfcRoundedRectangleProfileDef
          (IfcRoundedRectangleProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcRoundedRectangleProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef,_1UL> *)
             &(this->super_IfcRectangleProfileDef).field_0x90,vtt + 0x10);
  IfcRectangleProfileDef::~IfcRectangleProfileDef(&this->super_IfcRectangleProfileDef,vtt + 1);
  return;
}

Assistant:

IfcRoundedRectangleProfileDef() : Object("IfcRoundedRectangleProfileDef") {}